

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString_&>,_char16_t>,_QString>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString_&>,_char16_t>,_QString>
          *this)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  iterator d;
  QChar *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString_&>::isNull
            ((QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString_&> *)this);
  qVar1 = QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString_&>,_char16_t>,_QString>_>
          ::size(this);
  (__return_storage_ptr__->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).size = -0x5555555555555556;
  QString::QString(__return_storage_ptr__,qVar1,Uninitialized);
  local_20 = (QChar *)(__return_storage_ptr__->d).ptr;
  QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString_&,_QLatin1String>,_QString_&>,_char16_t>,_QString>_>
  ::appendTo<QChar>(this,&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }